

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::ConditionalStatement::Condition>::
emplaceRealloc<slang::ast::ConditionalStatement::Condition>
          (SmallVectorBase<slang::ast::ConditionalStatement::Condition> *this,pointer pos,
          Condition *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  Pattern *pPVar3;
  Condition *__cur_1;
  pointer pCVar4;
  pointer pCVar5;
  pointer pCVar6;
  pointer pCVar7;
  EVP_PKEY_CTX *pEVar8;
  EVP_PKEY_CTX *ctx;
  long lVar9;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar8 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar8 < ctx) {
    pEVar8 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar8 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar9 = (long)pos - (long)this->data_;
  pCVar4 = (pointer)operator_new((long)pEVar8 << 4);
  pPVar3 = args->pattern;
  *(undefined8 *)((long)pCVar4 + lVar9) = (args->expr).ptr;
  ((undefined8 *)((long)pCVar4 + lVar9))[1] = pPVar3;
  pCVar7 = this->data_;
  pCVar5 = pCVar7 + this->len;
  pCVar6 = pCVar4;
  if (pCVar5 == pos) {
    for (; pCVar7 != pos; pCVar7 = pCVar7 + 1) {
      pPVar3 = pCVar7->pattern;
      (pCVar6->expr).ptr = (pCVar7->expr).ptr;
      pCVar6->pattern = pPVar3;
      pCVar6 = pCVar6 + 1;
    }
  }
  else {
    for (; pCVar7 != pos; pCVar7 = pCVar7 + 1) {
      pPVar3 = pCVar7->pattern;
      (pCVar6->expr).ptr = (pCVar7->expr).ptr;
      pCVar6->pattern = pPVar3;
      pCVar6 = pCVar6 + 1;
    }
    puVar2 = (undefined8 *)(lVar9 + (long)pCVar4);
    for (; pos != pCVar5; pos = pos + 1) {
      pPVar3 = pos->pattern;
      puVar2[2] = (pos->expr).ptr;
      puVar2[3] = pPVar3;
      puVar2 = puVar2 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar8;
  this->data_ = pCVar4;
  return (pointer)((long)pCVar4 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}